

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending-c.cpp
# Opt level: O3

char * duckdb_pending_error(duckdb_pending_result pending_result)

{
  pointer this;
  string *psVar1;
  
  if ((pending_result != (duckdb_pending_result)0x0) && (*(long *)pending_result != 0)) {
    this = duckdb::
           unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)pending_result);
    psVar1 = duckdb::BaseQueryResult::GetError_abi_cxx11_(&this->super_BaseQueryResult);
    return (psVar1->_M_dataplus)._M_p;
  }
  return (char *)0x0;
}

Assistant:

const char *duckdb_pending_error(duckdb_pending_result pending_result) {
	if (!pending_result) {
		return nullptr;
	}
	auto wrapper = reinterpret_cast<PendingStatementWrapper *>(pending_result);
	if (!wrapper->statement) {
		return nullptr;
	}
	return wrapper->statement->GetError().c_str();
}